

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNAdaptController SUNAdaptController_H211(SUNContext_conflict sunctx)

{
  SUNAdaptController C_00;
  SUNAdaptController C;
  SUNContext_conflict sunctx_local_scope_;
  
  C_00 = SUNAdaptController_Soderlind((SUNContext_conflict)C);
  SUNAdaptController_SetParams_Soderlind(C_00,0.25,0.25,0.0,-0.25,0.0);
  return C_00;
}

Assistant:

SUNAdaptController SUNAdaptController_H211(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(
    SUNAdaptController_SetParams_Soderlind(C, SUN_RCONST(0.25),
                                           SUN_RCONST(0.25), SUN_RCONST(0.0),
                                           -SUN_RCONST(0.25), SUN_RCONST(0.0)));

  return (C);
}